

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DACSThinker::StopScriptsFor(DACSThinker *this,AActor *actor)

{
  DLevelScript *pDVar1;
  AActor *pAVar2;
  DLevelScript *pDVar3;
  
  pDVar1 = this->Scripts;
  while (pDVar3 = pDVar1, pDVar3 != (DLevelScript *)0x0) {
    pDVar1 = pDVar3->next;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&pDVar3->activator);
    if (pAVar2 == actor) {
      pDVar3->state = SCRIPT_PleaseRemove;
    }
  }
  return;
}

Assistant:

void DACSThinker::StopScriptsFor (AActor *actor)
{
	DLevelScript *script = Scripts;

	while (script != NULL)
	{
		DLevelScript *next = script->next;
		if (script->activator == actor)
		{
			script->SetState (DLevelScript::SCRIPT_PleaseRemove);
		}
		script = next;
	}
}